

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::CreateFromVertexIdList
          (ON_SubDComponentList *this,ON_SubD *subd,ON_SimpleArray<unsigned_int> *vertex_id_list)

{
  uint vertex_id_00;
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDVertex *v;
  uint vertex_id;
  uint i;
  uint marked_count;
  undefined1 local_60 [4];
  uint count;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SimpleArray<unsigned_int> *vertex_id_list_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  saved_marks._56_8_ = vertex_id_list;
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60,subd);
  uVar2 = ON_SimpleArray<unsigned_int>::UnsignedCount
                    ((ON_SimpleArray<unsigned_int> *)saved_marks._56_8_);
  vertex_id = 0;
  for (v._4_4_ = 0; v._4_4_ < uVar2; v._4_4_ = v._4_4_ + 1) {
    puVar3 = ON_SimpleArray<unsigned_int>::operator[]
                       ((ON_SimpleArray<unsigned_int> *)saved_marks._56_8_,v._4_4_);
    vertex_id_00 = *puVar3;
    if ((((vertex_id_00 != 0) && (vertex_id_00 != 0xffffffff)) &&
        (pOVar4 = ON_SubD::VertexFromId(subd,vertex_id_00), pOVar4 != (ON_SubDVertex *)0x0)) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark(&(pOVar4->super_ON_SubDComponentBase).m_status),
       !bVar1)) {
      ON_ComponentStatus::SetRuntimeMark(&(pOVar4->super_ON_SubDComponentBase).m_status);
      vertex_id = vertex_id + 1;
    }
  }
  uVar2 = Internal_Create(this,subd,true,false,false,true,vertex_id);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromVertexIdList(const ON_SubD& subd, const ON_SimpleArray<unsigned>& vertex_id_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = vertex_id_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const unsigned vertex_id = vertex_id_list[i];
    if (vertex_id <= 0 || vertex_id >= ON_UNSET_UINT_INDEX)
      continue;
    const ON_SubDVertex* v = subd.VertexFromId(vertex_id);
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, false, false, true, marked_count);
}